

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::ChaiScript::internal_eval_file(ChaiScript *this,string *t_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  file_not_found_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar2;
  Boxed_Value BVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           ((long)&t_filename[7].field_2 + 8);
  bVar2 = __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   t_filename[8]._M_dataplus._M_p;
  if (bVar2) {
    std::operator+(&local_50,__lhs,in_RDX);
    load_file(&local_70,&local_50);
    BVar3 = do_eval(this,t_filename,&local_70,SUB81(&local_50,0));
    _Var1._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX_00;
    }
    if (bVar2) {
      BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var1._M_pi;
      BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar3.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (file_not_found_error *)__cxa_allocate_exception(0x10);
  exception::file_not_found_error::file_not_found_error(this_00,in_RDX);
  __cxa_throw(this_00,&exception::file_not_found_error::typeinfo,std::runtime_error::~runtime_error)
  ;
}

Assistant:

const Boxed_Value internal_eval_file(const std::string &t_filename) {
      for (const auto &path : m_use_paths)
      {
        try {
          const auto appendedpath = path + t_filename;
          return do_eval(load_file(appendedpath), appendedpath, true);
        } catch (const exception::file_not_found_error &) {
          // failed to load, try the next path
        } catch (const exception::eval_error &t_ee) {
          throw Boxed_Value(t_ee);
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);

    }